

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_3bit_ea(m68k_info *info,int opcode,int size)

{
  cs_m68k *pcVar1;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar2;
  
  pcVar1 = build_init_op(info,opcode,2,size);
  pcVar1->operands[0].type = M68K_OP_IMM;
  pcVar1->operands[0].address_mode = M68K_AM_IMMEDIATE;
  aVar2.reg_pair.reg_1 = 0;
  aVar2.simm = (float)*(uint *)((long)g_3bit_qdata_table + (ulong)(info->ir >> 7 & 0x1c));
  pcVar1->operands[0].field_0 = aVar2;
  get_ea_mode_op(info,pcVar1->operands + 1,info->ir,size);
  return;
}

Assistant:

static void build_3bit_ea(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->type = M68K_OP_IMM;
	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->imm = g_3bit_qdata_table[(info->ir >> 9) & 7];

	get_ea_mode_op(info, op1, info->ir, size);
}